

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSapBroadphase.cpp
# Opt level: O3

void __thiscall btMultiSapBroadphase::printStats(btMultiSapBroadphase *this)

{
  return;
}

Assistant:

void	btMultiSapBroadphase::printStats()
{
/*	printf("---------------------------------\n");
	
		printf("btMultiSapBroadphase.h\n");
		printf("numHandles = %d\n",m_multiSapProxies.size());
			//find broadphase that contain this multiProxy
		int numChildBroadphases = getBroadphaseArray().size();
		for (int i=0;i<numChildBroadphases;i++)
		{

			btBroadphaseInterface* childBroadphase = getBroadphaseArray()[i];
			childBroadphase->printStats();

		}
		*/

}